

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeRepresentation.hpp
# Opt level: O0

baseType count_time<9,_long>::convert(double t)

{
  baseType bVar1;
  double in_XMM0_Qa;
  double dVar2;
  undefined8 local_30;
  undefined8 local_28;
  
  bVar1 = minVal();
  dVar2 = toDouble(bVar1 + 10000);
  if (in_XMM0_Qa <= dVar2) {
    local_30 = minVal();
  }
  else {
    bVar1 = maxVal();
    dVar2 = toDouble(bVar1 + -10000);
    if (dVar2 <= in_XMM0_Qa) {
      local_28 = maxVal();
    }
    else {
      local_28 = quick_round<long>(in_XMM0_Qa * 1000000000.0);
    }
    local_30 = local_28;
  }
  return local_30;
}

Assistant:

static constexpr baseType convert(double t) noexcept
    {
        // 10000 is to allow a little wiggle room in the conversion from double
        // the absolute minimum it could be is 1024 to allow for conversion to
        // double of maxVal then back to time,  those should be consistent,
        // supporting float would require a much bigger number
        return (t > toDouble(minVal() + 10000)) ?
            ((t < toDouble(maxVal() - 10000)) ?
                 (quick_round<baseType>(t * dFactor)) :
                 maxVal()) :
            minVal();
    }